

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

char * CVmObjFileName::get_local_path(vm_val_t *val)

{
  int iVar1;
  CVmObject *pCVar2;
  vm_filnam_ext *pvVar3;
  int *in_RDI;
  char *str;
  CVmObjFileName *fn;
  char *local_8;
  
  if (*in_RDI == 5) {
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[1])(pCVar2,metaclass_reg_);
    if (iVar1 != 0) {
      pCVar2 = vm_objp(0);
      goto LAB_0033c240;
    }
  }
  pCVar2 = (CVmObject *)0x0;
LAB_0033c240:
  if (pCVar2 == (CVmObject *)0x0) {
    local_8 = vm_val_t::get_as_string((vm_val_t *)0x0);
    if (local_8 == (char *)0x0) {
      local_8 = (char *)0x0;
    }
  }
  else {
    pvVar3 = get_ext((CVmObjFileName *)pCVar2);
    local_8 = pvVar3->str;
  }
  return local_8;
}

Assistant:

const char *CVmObjFileName::get_local_path(VMG_ const vm_val_t *val)
{
    CVmObjFileName *fn;
    const char *str;
    if ((fn = vm_val_cast(CVmObjFileName, val)) != 0)
    {
        /* it's a FileName object - return a copy of its filename string */
        return fn->get_ext()->str;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* it's a string, so convert from URL notation to local path syntax */
        return str;
    }
    else
    {
        /* it's not a string or FileName */
        return 0;
    }
}